

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceDistanceGraphPath.cc
# Opt level: O3

string * __thiscall
SequenceDistanceGraphPath::sequence_abi_cxx11_
          (string *__return_storage_ptr__,SequenceDistanceGraphPath *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  pointer plVar3;
  pointer pNVar4;
  long lVar5;
  pointer pvVar6;
  pointer pLVar7;
  pointer pcVar8;
  ostream *poVar9;
  pointer pLVar10;
  runtime_error *prVar11;
  char cVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  long *n_1;
  long *n;
  pointer plVar16;
  long *plVar17;
  vector<long,_std::allocator<long>_> *__range2;
  long *plVar18;
  string nseq;
  value_type rcn;
  undefined1 *local_170;
  undefined8 local_168;
  undefined1 local_160;
  undefined7 uStack_15f;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_150;
  SequenceDistanceGraphPath *local_148;
  long *local_140;
  Node local_138 [4];
  
  poVar9 = sdglib::OutputLog(DEBUG,true);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,"sequence for a SequenceDistanceGraphPath with nodes = [",0x37);
  if (sdglib::OutputLogLevel == 2) {
    plVar3 = (this->nodes).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (plVar16 = (this->nodes).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start; plVar16 != plVar3; plVar16 = plVar16 + 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      std::ostream::_M_insert<long>((long)&std::cout);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ]",2);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
  }
  local_150 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  plVar17 = (this->nodes).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start;
  plVar18 = (this->nodes).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (plVar17 != plVar18) {
    lVar15 = 0;
    local_148 = this;
    local_140 = plVar18;
    do {
      local_170 = &local_160;
      local_168 = 0;
      local_160 = 0;
      lVar13 = *plVar17;
      if (lVar13 < 1) {
        pNVar4 = (this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Vector_impl_data._M_start;
        paVar1 = &local_138[0].sequence.field_2;
        lVar5 = *(long *)&pNVar4[-lVar13].sequence._M_dataplus;
        local_138[0].sequence._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_138,lVar5,pNVar4[-lVar13].sequence._M_string_length + lVar5);
        local_138[0].support.id = pNVar4[-lVar13].support.id;
        local_138[0].status = pNVar4[-lVar13].status;
        local_138[0]._33_7_ = *(undefined7 *)&pNVar4[-lVar13].field_0x21;
        pNVar4 = pNVar4 + -lVar13;
        local_138[0].support.type = (pNVar4->support).type;
        local_138[0].support._1_1_ = (pNVar4->support).field_0x1;
        local_138[0].support.index = (pNVar4->support).index;
        local_138[0].support._4_4_ = *(undefined4 *)&(pNVar4->support).field_0x4;
        Node::make_rc(local_138);
        std::__cxx11::string::_M_assign((string *)&local_170);
        plVar18 = local_140;
        this = local_148;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138[0].sequence._M_dataplus._M_p != paVar1) {
          operator_delete(local_138[0].sequence._M_dataplus._M_p,
                          local_138[0].sequence.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::__cxx11::string::_M_assign((string *)&local_170);
      }
      if (lVar15 != 0) {
        lVar13 = -lVar15;
        if (0 < lVar15) {
          lVar13 = lVar15;
        }
        pvVar6 = (this->sg->super_DistanceGraph).links.
                 super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pLVar7 = *(pointer *)
                  ((long)&pvVar6[lVar13].super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                          super__Vector_impl_data + 8);
        for (pLVar10 = pvVar6[lVar13].super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                       super__Vector_impl_data._M_start;
            (pLVar10 != pLVar7 && ((pLVar10->source != lVar15 || (pLVar10->dest != *plVar17))));
            pLVar10 = pLVar10 + 1) {
        }
        if (pLVar10 == pLVar7) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"can\'t find a link between ",0x1a);
          poVar9 = std::ostream::_M_insert<long>((long)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," and ",5);
          poVar9 = std::ostream::_M_insert<long>((long)poVar9);
          std::endl<char,std::char_traits<char>>(poVar9);
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar11,"path has no link");
          __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar2 = pLVar10->dist;
        if ((int)uVar2 < 1) {
          pcVar8 = (__return_storage_ptr__->_M_dataplus)._M_p;
          cVar12 = pcVar8[__return_storage_ptr__->_M_string_length - (ulong)-uVar2];
          if (cVar12 != '\0') {
            lVar15 = 0;
            do {
              if (cVar12 != local_170[lVar15]) {
                sprintf((char *)local_138,"path overlap is invalid! (%d,%d,%d)",pLVar10->source,
                        pLVar10->dest,(ulong)uVar2);
                prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar11,(char *)local_138);
                __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              cVar12 = pcVar8[lVar15 + (__return_storage_ptr__->_M_string_length - (ulong)-uVar2) +
                                       1];
              lVar15 = lVar15 + 1;
            } while (cVar12 != '\0');
          }
          std::__cxx11::string::erase((ulong)&local_170,0);
        }
        else {
          iVar14 = uVar2 + 1;
          do {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            iVar14 = iVar14 + -1;
          } while (1 < iVar14);
        }
      }
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_170);
      lVar15 = -*plVar17;
      if (local_170 != &local_160) {
        operator_delete(local_170,CONCAT71(uStack_15f,local_160) + 1);
      }
      plVar17 = plVar17 + 1;
    } while (plVar17 != plVar18);
  }
  poVar9 = sdglib::OutputLog(DEBUG,true);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,"sequence finished successfully for SequenceDistanceGraphPath with nodes = [",
             0x4b);
  if (sdglib::OutputLogLevel == 2) {
    plVar3 = (this->nodes).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (plVar16 = (this->nodes).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start; plVar16 != plVar3; plVar16 = plVar16 + 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      std::ostream::_M_insert<long>((long)&std::cout);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ]",2);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SequenceDistanceGraphPath::sequence() const {
    sdglib::OutputLog(sdglib::LogLevels::DEBUG) << "sequence for a SequenceDistanceGraphPath with nodes = [" ;
    if(sdglib::OutputLogLevel == sdglib::LogLevels::DEBUG) {
        for(auto &n:nodes) std::cout << " " << n;
        std::cout << " ]" << std::endl;
    }
    std::string s = "";
    sgNodeID_t pnode = 0;
    // just iterate over every node in path - contig names are converted to ids at construction
    for (auto &n:nodes) {
        std::string nseq;
        if (n>0){
            nseq = sg.nodes[n].sequence;
        } else {
            auto rcn = sg.nodes[-n];
            rcn.make_rc();
            nseq = rcn.sequence;
        }
        if (pnode !=0){
            //find link between pnode' output (+pnode) and n's sink (-n)
            auto l=sg.links[(pnode>0 ? pnode:-pnode)].begin();
            for (;l!=sg.links[(pnode>0 ? pnode:-pnode)].end();++l)
                if (l->source==pnode and l->dest==n) break;
            if (l==sg.links[(pnode>0 ? pnode:-pnode)].end()) {
                std::cout<<"can't find a link between "<<pnode<<" and "<<n<<std::endl;
                throw std::runtime_error("path has no link");
            } else {
                if (l->dist > 0){
                    for (auto c = l->dist; c > 0; --c) s += "N";
                }
                else {
                    auto ovl =- l->dist;
                    for (auto s1 = s.c_str() + s.size() - ovl, s2 = nseq.c_str(); *s1 != NULL; ++s1, ++s2)
                        if (*s1 != *s2) {
                            char buffer[250];
                            sprintf(buffer,"path overlap is invalid! (%d,%d,%d)",l->source,l->dest,l->dist);
                            throw std::runtime_error(buffer);
                        }
                    nseq.erase(0, ovl);
                }
            }
        }
        s+=nseq;
        pnode=-n;
    }
    sdglib::OutputLog(sdglib::LogLevels::DEBUG) << "sequence finished successfully for SequenceDistanceGraphPath with nodes = [" ;
    if(sdglib::OutputLogLevel == sdglib::LogLevels::DEBUG) {
        for(auto &n:nodes) std::cout<<" "<<n;
        std::cout<<" ]"<<std::endl;
    }
    return s;
}